

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall cmQtAutoGenInitializer::handleSkipPch(cmQtAutoGenInitializer *this,cmSourceFile *sf)

{
  cmSourceFile *this_00;
  bool bVar1;
  bool bVar2;
  cmValue cVar3;
  _Hash_node_base *p_Var4;
  char *__end;
  string local_58;
  cmSourceFile *local_38;
  
  p_Var4 = (this->AutogenTarget).Sources._M_h._M_before_begin._M_nxt;
  if (p_Var4 != (_Hash_node_base *)0x0) {
    bVar1 = true;
    local_38 = sf;
    do {
      bVar2 = cmSourceFile::GetIsGenerated((cmSourceFile *)p_Var4[1]._M_nxt,GlobalAndLocal);
      if (!bVar2) {
        this_00 = (cmSourceFile *)p_Var4[1]._M_nxt;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_58,"SKIP_PRECOMPILE_HEADERS","");
        cVar3 = cmSourceFile::GetProperty(this_00,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        bVar1 = (bool)(bVar1 & cVar3.Value != (string *)0x0);
      }
      p_Var4 = p_Var4->_M_nxt;
    } while (p_Var4 != (_Hash_node_base *)0x0);
    sf = local_38;
    if (!bVar1) {
      return;
    }
  }
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"SKIP_PRECOMPILE_HEADERS","");
  cmSourceFile::SetProperty(sf,&local_58,"ON");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void cmQtAutoGenInitializer::handleSkipPch(cmSourceFile* sf)
{
  bool skipPch = true;
  for (auto const& pair : this->AutogenTarget.Sources) {
    if (!pair.first->GetIsGenerated() &&
        !pair.first->GetProperty("SKIP_PRECOMPILE_HEADERS")) {
      skipPch = false;
    }
  }

  if (skipPch) {
    sf->SetProperty("SKIP_PRECOMPILE_HEADERS", "ON");
  }
}